

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

TabularCPT * __thiscall
despot::Parser::CreateTabularStateTransition(Parser *this,TiXmlElement *e_CondProb)

{
  NamedVar *child;
  pointer pdVar1;
  bool bVar2;
  bool bVar3;
  bool condition;
  int iVar4;
  TiXmlNode *pTVar5;
  mapped_type *ppVVar6;
  TabularCPT *this_00;
  TiXmlElement *pTVar7;
  pointer pbVar8;
  TiXmlElement *pTVar9;
  pointer pbVar10;
  int j;
  int iVar11;
  ulong uVar12;
  Parser *this_01;
  int i;
  long lVar13;
  long lVar14;
  double dVar15;
  string parent_name;
  string local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<double,_std::allocator<double>_> values;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_1c8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  GetFirstChildText_abi_cxx11_(&name,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_110,(string *)&name);
  bVar2 = Variable::IsVariableName(&local_110,&this->curr_state_vars_);
  std::operator+(&parent_name,"In <StateTransitionFunction>: Var ",&name);
  std::operator+(&local_130,&parent_name,
                 " has not been declared as a StateVar vnameCurr within the <Variable> tag.");
  pTVar5 = util::tinyxml::TiXmlNode::FirstChild(&e_CondProb->super_TiXmlNode,"Var");
  Ensure(this,bVar2,&local_130,&pTVar5->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&parent_name);
  std::__cxx11::string::~string((string *)&local_110);
  ppVVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](&this->variables_,&name);
  child = (NamedVar *)*ppVVar6;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetFirstChildText_abi_cxx11_(&parent_name,this,e_CondProb,"Parent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0," ",(allocator<char> *)&local_238);
  Tokenize(&parent_names,&parent_name,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&parent_name);
  lVar13 = 0;
  uVar12 = 0;
  do {
    if ((ulong)((long)parent_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)parent_names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar12) {
      this_00 = (TabularCPT *)operator_new(0x70);
      std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
                ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1c8,
                 &parents);
      TabularCPT::TabularCPT
                (this_00,child,
                 (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_1c8);
      std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                (&local_1c8);
      pTVar7 = GetParameterElement(this,e_CondProb);
      pTVar7 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar7->super_TiXmlNode,"Entry");
      while (pTVar7 != (TiXmlElement *)0x0) {
        GetFirstChildText_abi_cxx11_(&parent_name,this,pTVar7,"Instance");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0," ",(allocator<char> *)&local_238);
        Tokenize(&instance,&parent_name,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&parent_name);
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        this_01 = (Parser *)&parent_name;
        GetFirstChildText_abi_cxx11_(&parent_name,this,pTVar7,"ProbTable");
        iVar4 = ComputeNumOfEntries(this_01,&instance,&parents,child);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&parent_name,"uniform");
        if (bVar2) {
          pbVar8 = (child->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar10 = (child->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          while (bVar2 = iVar4 != 0, iVar4 = iVar4 + -1, bVar2) {
            local_2a0._M_dataplus._M_p =
                 (pointer)(1.0 / (double)(int)((ulong)((long)pbVar8 - (long)pbVar10) >> 5));
            std::vector<double,_std::allocator<double>_>::emplace_back<double>
                      ((vector<double,_std::allocator<double>_> *)
                       &values.super__Vector_base<double,_std::allocator<double>_>,
                       (double *)&local_2a0);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&parent_name,"identity");
          if (bVar2) {
            pbVar8 = (child->super_Variable).values_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pbVar10 = (child->super_Variable).values_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (iVar4 = 0; iVar4 < (int)((ulong)((long)pbVar10 - (long)pbVar8) >> 5);
                iVar4 = iVar4 + 1) {
              for (iVar11 = 0; iVar11 < (int)((ulong)((long)pbVar10 - (long)pbVar8) >> 5);
                  iVar11 = iVar11 + 1) {
                local_2a0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
                if (iVar4 != iVar11) {
                  local_2a0._M_dataplus._M_p = (pointer)0x0;
                }
                std::vector<double,_std::allocator<double>_>::emplace_back<double>
                          ((vector<double,_std::allocator<double>_> *)
                           &values.super__Vector_base<double,_std::allocator<double>_>,
                           (double *)&local_2a0);
                pbVar8 = (child->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pbVar10 = (child->super_Variable).values_.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              }
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2a0," ",(allocator<char> *)&local_238);
            Tokenize(&value_tokens,&parent_name,&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
            lVar13 = (long)value_tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)value_tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            to_string<int>(&local_b0,iVar4);
            std::operator+(&local_190,"In <StateTransitionFunction>: ",&local_b0);
            std::operator+(&local_238,&local_190," entries expected but ");
            to_string<unsigned_long>
                      (&local_d0,
                       (long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            std::operator+(&local_2a0,&local_238,&local_d0);
            std::operator+(&local_90,&local_2a0," found.");
            pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement
                               (&pTVar7->super_TiXmlNode,"ProbTable");
            Ensure(this,lVar13 >> 5 == (long)iVar4,&local_90,(TiXmlBase *)pTVar9);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_238);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_b0);
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       &values.super__Vector_base<double,_std::allocator<double>_>,
                       (long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
            pdVar1 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar13 = (long)value_tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)value_tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            pbVar8 = value_tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            for (lVar14 = 0; lVar13 >> 5 != lVar14; lVar14 = lVar14 + 1) {
              dVar15 = atof((pbVar8->_M_dataplus)._M_p);
              pdVar1[lVar14] = dVar15;
              pbVar8 = pbVar8 + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&value_tokens);
          }
        }
        iVar4 = (*(this_00->super_CPT).super_Function._vptr_Function[2])
                          (this_00,&instance,
                           &values.super__Vector_base<double,_std::allocator<double>_>);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"In <StateTransitionFunction>: Value assignment failed.",
                   (allocator<char> *)&local_2a0);
        pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar7->super_TiXmlNode,"Instance");
        Ensure(this,SUB41(iVar4,0),&local_f0,(TiXmlBase *)pTVar9);
        std::__cxx11::string::~string((string *)&local_f0);
        pTVar7 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar7->super_TiXmlNode);
        std::__cxx11::string::~string((string *)&parent_name);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&values.super__Vector_base<double,_std::allocator<double>_>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&instance);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&parent_names);
      std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
                (&parents.
                  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>);
      std::__cxx11::string::~string((string *)&name);
      return this_00;
    }
    std::__cxx11::string::string
              ((string *)&parent_name,
               (string *)
               ((long)&((parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
    std::__cxx11::string::string((string *)&local_50,(string *)&parent_name);
    bVar2 = Variable::IsVariableName(&local_50,&this->prev_state_vars_);
    condition = true;
    if (bVar2) {
LAB_0015d41e:
      bVar3 = false;
    }
    else {
      std::__cxx11::string::string((string *)&local_150,(string *)&parent_name);
      bVar3 = Variable::IsVariableName(&local_150,&this->curr_state_vars_);
      if (bVar3) goto LAB_0015d41e;
      std::__cxx11::string::string((string *)&local_170,(string *)&parent_name);
      condition = Variable::IsVariableName(&local_170,&this->action_vars_);
      bVar3 = true;
    }
    std::operator+(&local_2a0,"In <StateTransitionFunction>: Parent ",&parent_name);
    std::operator+(&local_70,&local_2a0,
                   " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar5 = util::tinyxml::TiXmlNode::FirstChild(&e_CondProb->super_TiXmlNode,"Parent");
    Ensure(this,condition,&local_70,&pTVar5->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_2a0);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_170);
    }
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)&local_50);
    ppVVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](&this->variables_,&parent_name);
    local_2a0._M_dataplus._M_p = (pointer)*ppVVar6;
    std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
    emplace_back<despot::NamedVar*>
              ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parents,
               (NamedVar **)&local_2a0);
    std::__cxx11::string::~string((string *)&parent_name);
    uVar12 = uVar12 + 1;
    lVar13 = lVar13 + 0x20;
  } while( true );
}

Assistant:

TabularCPT* Parser::CreateTabularStateTransition(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, curr_state_vars_),
		"In <StateTransitionFunction>: Var " + name
			+ " has not been declared as a StateVar vnameCurr within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	StateVar* child = static_cast<StateVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, prev_state_vars_)
				|| Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <StateTransitionFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnamePrev/vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	TabularCPT* func = new TabularCPT(child, parents);

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		int num_entries = ComputeNumOfEntries(instance, parents, child);

		if (table == "uniform") { // keyword uniform
			int num = child->Size();
			for (int i = 0; i < num_entries; i++) {
				values.push_back(1.0 / num);
			}
		} else if (table == "identity") { // keyword identity
			//EnsureIdentityIsValid(); // TODO
			for (int i = 0; i < child->Size(); i++) {
				for (int j = 0; j < child->Size(); j++) {
					values.push_back(i == j);
				}
			}
		} else { // numbers
			vector<string> value_tokens = Tokenize(table);

			Ensure(num_entries == value_tokens.size(),
				"In <StateTransitionFunction>: " + to_string(num_entries)
					+ " entries expected but " + to_string(value_tokens.size())
					+ " found.", GetFirstChildElement(e_Entry, "ProbTable"));

			values.resize(value_tokens.size());
			for (int i = 0; i < value_tokens.size(); i++) {
				values[i] = atof(value_tokens[i].c_str());
			}
		}

		bool success = func->SetValue(instance, values);

		Ensure(success,
			"In <StateTransitionFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}